

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebp_test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "This program is just for build system testing.  Don\'t actually run it."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  abort();
}

Assistant:

int main()
{
    std::cerr << "This program is just for build system testing.  Don't actually run it." << std::endl;
    std::abort();

    uint8_t* data;
    size_t output_size = 0;
    int width, height, stride;
    float quality;
    output_size = WebPEncodeRGB(data, width, height, stride, quality, &data);
    WebPDecodeRGBInto(data, output_size, data, output_size, stride);
    WebPFree(data);
}